

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall
inja::ParserError::ParserError(ParserError *this,string *message,SourceLocation location)

{
  SourceLocation location_00;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *message_local;
  ParserError *this_local;
  SourceLocation location_local;
  
  location_local.line = location.column;
  this_local = (ParserError *)location.line;
  local_28 = message;
  message_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"parser_error",&local_49)
  ;
  location_00.column = location_local.line;
  location_00.line = (size_t)this_local;
  InjaError::InjaError(&this->super_InjaError,&local_48,local_28,location_00);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator(&local_49);
  *(undefined ***)&this->super_InjaError = &PTR__ParserError_0024d520;
  return;
}

Assistant:

explicit ParserError(const std::string& message, SourceLocation location): InjaError("parser_error", message, location) {}